

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void gen_spr_74xx(CPUPPCState_conflict2 *env)

{
  CPUPPCState_conflict2 *env_local;
  
  _spr_register(env,0x3ff,"PIR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_pir,
                spr_read_generic,spr_write_pir,0);
  _spr_register(env,0x3b0,"MMCR2",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3a0,"UMMCR2",spr_read_ureg,spr_noaccess,spr_read_ureg,spr_noaccess,
                spr_read_ureg,spr_noaccess,0);
  _spr_register(env,0x3b7,"BAMR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3f6,"MSSCR0",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3f0,"HID0",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3f1,"HID1",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x100,"VRSAVE",spr_read_generic,spr_write_generic,spr_read_generic,
                spr_write_generic,spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3f9,"L2CR",spr_noaccess,spr_noaccess,spr_read_generic,spr_access_nop,
                spr_read_generic,spr_access_nop,0);
  vscr_init(env,0x10000);
  return;
}

Assistant:

static void gen_spr_74xx(CPUPPCState *env)
{
    /* Processor identification */
    spr_register(env, SPR_PIR, "PIR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_pir,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_74XX_MMCR2, "MMCR2",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_74XX_UMMCR2, "UMMCR2",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX: not implemented */
    spr_register(env, SPR_BAMR, "BAMR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_MSSCR0, "MSSCR0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Hardware implementation registers */
    /* XXX : not implemented */
    spr_register(env, SPR_HID0, "HID0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_HID1, "HID1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Altivec */
    spr_register(env, SPR_VRSAVE, "VRSAVE",
                 &spr_read_generic, &spr_write_generic,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_L2CR, "L2CR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, spr_access_nop,
                 0x00000000);
    /* Not strictly an SPR */
    vscr_init(env, 0x00010000);
}